

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_tls.cc
# Opt level: O0

int aead_tls_init(EVP_AEAD_CTX *ctx,uint8_t *key,size_t key_len,size_t tag_len,
                 evp_aead_direction_t dir,EVP_CIPHER *cipher,EVP_MD *md,char implicit_iv)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  undefined4 extraout_var;
  size_t sVar4;
  ulong n;
  evp_aead_ctx_st_state *a;
  uchar *local_98;
  uint local_74;
  AEAD_TLS_CTX *tls_ctx;
  size_t enc_key_len;
  size_t mac_key_len;
  EVP_CIPHER *cipher_local;
  evp_aead_direction_t dir_local;
  size_t tag_len_local;
  size_t key_len_local;
  uint8_t *key_local;
  EVP_AEAD_CTX *ctx_local;
  undefined4 extraout_var_00;
  
  if ((tag_len != 0) && (iVar1 = EVP_MD_size((EVP_MD *)md), tag_len != CONCAT44(extraout_var,iVar1))
     ) {
    ERR_put_error(0x1e,0,0x7a,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                  ,0x3f);
    return 0;
  }
  sVar4 = EVP_AEAD_key_length(ctx->aead);
  if (key_len == sVar4) {
    iVar1 = EVP_MD_size((EVP_MD *)md);
    n = CONCAT44(extraout_var_00,iVar1);
    uVar2 = EVP_CIPHER_key_length((EVP_CIPHER *)cipher);
    if (implicit_iv == '\0') {
      local_74 = 0;
    }
    else {
      local_74 = EVP_CIPHER_iv_length((EVP_CIPHER *)cipher);
    }
    if (n + uVar2 + (ulong)local_74 != key_len) {
      __assert_fail("mac_key_len + enc_key_len + (implicit_iv ? EVP_CIPHER_iv_length(cipher) : 0) == key_len"
                    ,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                    ,0x4b,
                    "int aead_tls_init(EVP_AEAD_CTX *, const uint8_t *, size_t, size_t, enum evp_aead_direction_t, const EVP_CIPHER *, const EVP_MD *, char)"
                   );
    }
    a = &ctx->state;
    EVP_CIPHER_CTX_init((EVP_CIPHER_CTX *)a);
    HMAC_CTX_init((HMAC_CTX *)((long)&ctx->state + 0x98));
    if (0x40 < n) {
      __assert_fail("mac_key_len <= EVP_MAX_MD_SIZE",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                    ,0x50,
                    "int aead_tls_init(EVP_AEAD_CTX *, const uint8_t *, size_t, size_t, enum evp_aead_direction_t, const EVP_CIPHER *, const EVP_MD *, char)"
                   );
    }
    OPENSSL_memcpy((void *)((long)&ctx->state + 0x100),key,n);
    (ctx->state).opaque[0x140] = (uint8_t)iVar1;
    (ctx->state).opaque[0x141] = implicit_iv;
    if (implicit_iv == '\0') {
      local_98 = (uchar *)0x0;
    }
    else {
      local_98 = key + n + uVar2;
    }
    iVar3 = EVP_CipherInit_ex((EVP_CIPHER_CTX *)a,(EVP_CIPHER *)cipher,(ENGINE *)0x0,key + n,
                              local_98,(uint)(dir == evp_aead_seal));
    if ((iVar3 != 0) &&
       (iVar1 = HMAC_Init_ex((HMAC_CTX *)((long)&ctx->state + 0x98),key,iVar1,(EVP_MD *)md,
                             (ENGINE *)0x0), iVar1 != 0)) {
      EVP_CIPHER_CTX_set_padding((EVP_CIPHER_CTX *)a,0);
      return 1;
    }
    aead_tls_cleanup(ctx);
  }
  else {
    ERR_put_error(0x1e,0,0x66,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_tls.cc"
                  ,0x44);
  }
  return 0;
}

Assistant:

static int aead_tls_init(EVP_AEAD_CTX *ctx, const uint8_t *key, size_t key_len,
                         size_t tag_len, enum evp_aead_direction_t dir,
                         const EVP_CIPHER *cipher, const EVP_MD *md,
                         char implicit_iv) {
  if (tag_len != EVP_AEAD_DEFAULT_TAG_LENGTH &&
      tag_len != EVP_MD_size(md)) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_UNSUPPORTED_TAG_SIZE);
    return 0;
  }

  if (key_len != EVP_AEAD_key_length(ctx->aead)) {
    OPENSSL_PUT_ERROR(CIPHER, CIPHER_R_BAD_KEY_LENGTH);
    return 0;
  }

  size_t mac_key_len = EVP_MD_size(md);
  size_t enc_key_len = EVP_CIPHER_key_length(cipher);
  assert(mac_key_len + enc_key_len +
         (implicit_iv ? EVP_CIPHER_iv_length(cipher) : 0) == key_len);

  AEAD_TLS_CTX *tls_ctx = (AEAD_TLS_CTX *)&ctx->state;
  EVP_CIPHER_CTX_init(&tls_ctx->cipher_ctx);
  HMAC_CTX_init(&tls_ctx->hmac_ctx);
  assert(mac_key_len <= EVP_MAX_MD_SIZE);
  OPENSSL_memcpy(tls_ctx->mac_key, key, mac_key_len);
  tls_ctx->mac_key_len = (uint8_t)mac_key_len;
  tls_ctx->implicit_iv = implicit_iv;

  if (!EVP_CipherInit_ex(&tls_ctx->cipher_ctx, cipher, NULL, &key[mac_key_len],
                         implicit_iv ? &key[mac_key_len + enc_key_len] : NULL,
                         dir == evp_aead_seal) ||
      !HMAC_Init_ex(&tls_ctx->hmac_ctx, key, mac_key_len, md, NULL)) {
    aead_tls_cleanup(ctx);
    return 0;
  }
  EVP_CIPHER_CTX_set_padding(&tls_ctx->cipher_ctx, 0);

  return 1;
}